

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  uint uVar1;
  stbi_uc *psVar2;
  long lVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  stbi_uc *psVar9;
  long in_FS_OFFSET;
  float fVar10;
  float fVar11;
  
  if (data != (float *)0x0) {
    psVar2 = (stbi_uc *)stbi__malloc_mad3(x,y,comp,0);
    if (psVar2 != (stbi_uc *)0x0) {
      if (0 < y * x) {
        uVar7 = ((comp & 1U) + comp) - 1;
        lVar6 = (long)comp;
        uVar5 = 0;
        pfVar4 = data;
        psVar9 = psVar2;
        do {
          uVar1 = 0;
          if (0 < (int)uVar7) {
            uVar8 = 0;
            do {
              fVar10 = powf(pfVar4[uVar8] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
              fVar11 = fVar10 * 255.0 + 0.5;
              fVar10 = 0.0;
              if (0.0 <= fVar11) {
                fVar10 = fVar11;
              }
              fVar11 = 255.0;
              if (fVar10 <= 255.0) {
                fVar11 = fVar10;
              }
              psVar9[uVar8] = (stbi_uc)(int)fVar11;
              uVar8 = uVar8 + 1;
              uVar1 = uVar7;
            } while (uVar7 != uVar8);
          }
          if ((int)uVar1 < comp) {
            lVar3 = (ulong)uVar1 + uVar5 * lVar6;
            fVar11 = data[lVar3] * 255.0 + 0.5;
            fVar10 = 0.0;
            if (0.0 <= fVar11) {
              fVar10 = fVar11;
            }
            fVar11 = 255.0;
            if (fVar10 <= 255.0) {
              fVar11 = fVar10;
            }
            psVar2[lVar3] = (stbi_uc)(int)fVar11;
          }
          uVar5 = uVar5 + 1;
          pfVar4 = pfVar4 + lVar6;
          psVar9 = psVar9 + lVar6;
        } while (uVar5 != (uint)(y * x));
      }
      free(data);
      return psVar2;
    }
    free(data);
    *(char **)(in_FS_OFFSET + -0x20) = "Out of memory";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}